

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O0

SparseTextureProperties * __thiscall
Diligent::TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties
          (TextureBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  Char *pCVar2;
  type pSVar3;
  char (*in_RCX) [26];
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  TextureBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  if ((this->
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      ).m_Desc.Usage != USAGE_SPARSE) {
    FormatString<char[64]>
              ((string *)local_30,
               (char (*) [64])"ITexture::GetSparseProperties() must be used for sparse texture");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [26])0x152;
    DebugAssertionFailed
              (pCVar2,"GetSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x152);
    std::__cxx11::string::~string((string *)local_30);
  }
  bVar1 = std::operator!=(&this->m_pSparseProps,(nullptr_t)0x0);
  if (!bVar1) {
    FormatString<char[26],char[26]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pSparseProps != nullptr",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x153);
    std::__cxx11::string::~string((string *)local_60);
  }
  pSVar3 = std::
           unique_ptr<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
           ::operator*(&this->m_pSparseProps);
  return pSVar3;
}

Assistant:

GetSparseProperties() const override final
    {
        DEV_CHECK_ERR(this->m_Desc.Usage == USAGE_SPARSE,
                      "ITexture::GetSparseProperties() must be used for sparse texture");
        VERIFY_EXPR(m_pSparseProps != nullptr);
        return *m_pSparseProps;
    }